

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranLexer.cxx
# Opt level: O2

void yyunput(int c,char *yy_bp,yyscan_t yyscanner)

{
  undefined1 *puVar1;
  undefined4 uVar2;
  undefined1 *puVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  undefined1 *puVar10;
  
  puVar3 = *(undefined1 **)((long)yyscanner + 0x40);
  *puVar3 = *(undefined1 *)((long)yyscanner + 0x30);
  lVar5 = *(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8);
  uVar4 = *(ulong *)(lVar5 + 8);
  if (puVar3 < (undefined1 *)(uVar4 + 2)) {
    uVar6 = (long)*(int *)((long)yyscanner + 0x34) + uVar4 + 2;
    lVar9 = uVar4 + (long)*(int *)(lVar5 + 0x18) + 2;
    puVar10 = (undefined1 *)((long)*(int *)(lVar5 + 0x18) + uVar4 + 1);
    uVar7 = uVar6;
    while (uVar4 < uVar6) {
      puVar1 = (undefined1 *)(uVar6 - 1);
      uVar6 = uVar6 - 1;
      *puVar10 = *puVar1;
      lVar5 = *(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8);
      lVar9 = lVar9 + -1;
      puVar10 = puVar10 + -1;
      uVar7 = uVar7 - 1;
      uVar4 = *(ulong *)(lVar5 + 8);
    }
    iVar8 = (int)lVar9 - (int)uVar7;
    puVar3 = puVar3 + iVar8;
    uVar2 = *(undefined4 *)(lVar5 + 0x18);
    *(undefined4 *)((long)yyscanner + 0x34) = uVar2;
    *(undefined4 *)(lVar5 + 0x1c) = uVar2;
    if (puVar3 < (undefined1 *)(uVar4 + 2)) {
      yy_fatal_error("flex scanner push-back overflow",yy_bp);
    }
    yy_bp = yy_bp + iVar8;
  }
  puVar3[-1] = (char)c;
  *(char **)((long)yyscanner + 0x80) = yy_bp;
  *(undefined1 *)((long)yyscanner + 0x30) = puVar3[-1];
  *(undefined1 **)((long)yyscanner + 0x40) = puVar3 + -1;
  return;
}

Assistant:

static void yyunput (int c, char * yy_bp , yyscan_t yyscanner)
{
	char *yy_cp;
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;

    yy_cp = yyg->yy_c_buf_p;

	/* undo effects of setting up yytext */
	*yy_cp = yyg->yy_hold_char;

	if ( yy_cp < YY_CURRENT_BUFFER_LVALUE->yy_ch_buf + 2 )
		{ /* need to shift things up to make room */
		/* +2 for EOB chars. */
		int number_to_move = yyg->yy_n_chars + 2;
		char *dest = &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[
					YY_CURRENT_BUFFER_LVALUE->yy_buf_size + 2];
		char *source =
				&YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[number_to_move];

		while ( source > YY_CURRENT_BUFFER_LVALUE->yy_ch_buf )
			*--dest = *--source;

		yy_cp += (int) (dest - source);
		yy_bp += (int) (dest - source);
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars =
			yyg->yy_n_chars = (int) YY_CURRENT_BUFFER_LVALUE->yy_buf_size;

		if ( yy_cp < YY_CURRENT_BUFFER_LVALUE->yy_ch_buf + 2 )
			YY_FATAL_ERROR( "flex scanner push-back overflow" );
		}

	*--yy_cp = (char) c;

	yyg->yytext_ptr = yy_bp;
	yyg->yy_hold_char = *yy_cp;
	yyg->yy_c_buf_p = yy_cp;
}